

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

void __thiscall minja::TextNode::TextNode(TextNode *this,Location *loc,string *t)

{
  string *in_RDX;
  TemplateNode *in_RDI;
  Location *in_stack_ffffffffffffffc8;
  
  TemplateNode::TemplateNode(in_RDI,in_stack_ffffffffffffffc8);
  in_RDI->_vptr_TemplateNode = (_func_int **)&PTR_do_render_0041b5a0;
  std::__cxx11::string::string((string *)(in_RDI + 1),in_RDX);
  return;
}

Assistant:

TextNode(const Location & loc, const std::string& t) : TemplateNode(loc), text(t) {}